

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

_Bool fp_access_check(DisasContext_conflict1 *s)

{
  uint64_t pc;
  uint32_t syndrome;
  bool bVar1;
  DisasContext_conflict1 *s_local;
  
  if ((s->fp_access_checked & 1U) != 0) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  bVar1 = s->fp_excp_el != 0;
  if (bVar1) {
    pc = s->pc_curr;
    syndrome = syn_fp_access_trap(1,0xe,false);
    gen_exception_insn(s,pc,1,syndrome,s->fp_excp_el);
  }
  s_local._7_1_ = !bVar1;
  return s_local._7_1_;
}

Assistant:

static inline bool fp_access_check(DisasContext *s)
{
    assert(!s->fp_access_checked);
    s->fp_access_checked = true;

    if (!s->fp_excp_el) {
        return true;
    }

    gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                       syn_fp_access_trap(1, 0xe, false), s->fp_excp_el);
    return false;
}